

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::CollationRuleParser::parse
          (CollationRuleParser *this,UnicodeString *ruleString,CollationSettings *outSettings,
          UParseError *outParseError,UErrorCode *errorCode)

{
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  this->settings = outSettings;
  this->parseError = outParseError;
  if (outParseError != (UParseError *)0x0) {
    outParseError->line = 0;
    outParseError->offset = -1;
    outParseError->preContext[0] = L'\0';
    outParseError->postContext[0] = L'\0';
  }
  this->errorReason = (char *)0x0;
  parse(this,ruleString,errorCode);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }